

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<18>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  long *plVar1;
  CodedOutputStream *in_RSI;
  void *in_RDI;
  
  plVar1 = Get<long>(in_RDI);
  WireFormatLite::ZigZagEncode64(*plVar1);
  io::CodedOutputStream::WriteVarint64(in_RSI,(uint64)in_RDI);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteSInt64NoTag(Get<int64>(ptr), output);
  }